

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall
wasm::BinaryInstWriter::visitArrayNewFixed(BinaryInstWriter *this,ArrayNewFixed *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  size_t sVar2;
  U32LEB local_2c;
  uintptr_t local_28;
  U32LEB local_1c;
  ArrayNewFixed *local_18;
  ArrayNewFixed *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNewFixed *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  pBVar1 = this->o;
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,8);
  BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  this_00 = this->parent;
  local_28 = (uintptr_t)
             wasm::Type::getHeapType
                       (&(local_18->super_SpecificExpression<(wasm::Expression::Id)73>).
                         super_Expression.type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,(HeapType)local_28);
  pBVar1 = this->o;
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(local_18->values).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,(uint)sVar2);
  BufferWithRandomAccess::operator<<(pBVar1,local_2c);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNewFixed(ArrayNewFixed* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayNewFixed);
  parent.writeIndexedHeapType(curr->type.getHeapType());
  o << U32LEB(curr->values.size());
}